

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O3

array<ArbitraryTestsFixtures::UserDefinedType,_2UL> *
cppqc::ArbitraryImpl<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>::unGen
          (array<ArbitraryTestsFixtures::UserDefinedType,_2UL> *__return_storage_ptr__,
          RngEngine *rng,size_t size)

{
  pointer *__ptr;
  long *local_28;
  _Head_base<0UL,_cppqc::detail::StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType>_*,_false>
  local_20;
  
  local_20._M_head_impl =
       (StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType> *)operator_new(0x10);
  ((local_20._M_head_impl)->super_GenConcept<ArbitraryTestsFixtures::UserDefinedType>).
  _vptr_GenConcept = (_func_int **)&PTR__GenConcept_002258a0;
  arrayOf<ArbitraryTestsFixtures::UserDefinedType,2ul>
            ((cppqc *)&local_28,
             (StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType> *)&local_20);
  (**(code **)(*local_28 + 0x10))(__return_storage_ptr__,local_28,rng,size);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
  if (local_20._M_head_impl != (StatelessGenConcept<ArbitraryTestsFixtures::UserDefinedType> *)0x0)
  {
    (*((local_20._M_head_impl)->super_GenConcept<ArbitraryTestsFixtures::UserDefinedType>).
      _vptr_GenConcept[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::array<T, N> unGen(RngEngine& rng, std::size_t size) {
    return arrayOf<T, N>().unGen(rng, size);
  }